

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void d_pass(D_Parser *ap,D_ParseNode *apn,int pass_number)

{
  D_Pass *pp_00;
  PNode *local_40;
  D_Pass *pp;
  Parser *p;
  PNode *pn;
  int pass_number_local;
  D_ParseNode *apn_local;
  D_Parser *ap_local;
  
  if (apn == (D_ParseNode *)0x0) {
    local_40 = (PNode *)0x0;
  }
  else {
    local_40 = (PNode *)(apn + -2);
  }
  if (*(int *)&(ap[1].initial_scope)->up <= pass_number) {
    d_fail("bad pass number: %d\n",(ulong)(uint)pass_number);
  }
  pp_00 = (D_Pass *)(&(ap[1].initial_scope)->up_updates->field_0x0 + (long)pass_number * 0x18);
  if ((pp_00->kind & 4) == 0) {
    if ((pp_00->kind & 1) == 0) {
      if ((pp_00->kind & 2) != 0) {
        pass_postorder((Parser *)ap,pp_00,local_40);
      }
    }
    else {
      pass_preorder((Parser *)ap,pp_00,local_40);
    }
  }
  else {
    pass_call((Parser *)ap,pp_00,local_40);
  }
  return;
}

Assistant:

void d_pass(D_Parser *ap, D_ParseNode *apn, int pass_number) {
  PNode *pn = D_ParseNode_to_PNode(apn);
  Parser *p = (Parser *)ap;
  D_Pass *pp;

  if (pass_number >= (int)p->t->npasses) d_fail("bad pass number: %d\n", pass_number);
  pp = &p->t->passes[pass_number];
  if (pp->kind & D_PASS_MANUAL)
    pass_call(p, pp, pn);
  else if (pp->kind & D_PASS_PRE_ORDER)
    pass_preorder(p, pp, pn);
  else if (pp->kind & D_PASS_POST_ORDER)
    pass_postorder(p, pp, pn);
}